

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

Type_Info * __thiscall
chaiscript::detail::Dispatch_Engine::get_type
          (Type_Info *__return_storage_ptr__,Dispatch_Engine *this,string_view name,bool t_throw)

{
  undefined4 uVar1;
  bool bVar2;
  pointer ppVar3;
  range_error *this_00;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined4 local_5c;
  _Self local_58 [3];
  _Self local_40;
  const_iterator itr;
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  bool t_throw_local;
  Dispatch_Engine *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (Dispatch_Engine *)name._M_len;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)&itr,&this->m_mutex);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::string,chaiscript::Type_Info,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>>
       ::find<std::basic_string_view<char,std::char_traits<char>>>
                 ((map<std::__cxx11::string,chaiscript::Type_Info,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>>
                   *)&(this->m_state).m_types,
                  (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info,_chaiscript::str_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
       ::end(&(this->m_state).m_types);
  bVar2 = std::operator==(&local_40,local_58);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    if (t_throw) {
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_a0,(basic_string_view<char,_std::char_traits<char>_> *)&this_local
                 ,&local_a1);
      std::operator+(&local_80,"Type Not Known: ",&local_a0);
      std::range_error::range_error(this_00,(string *)&local_80);
      __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    memset(__return_storage_ptr__,0,0x18);
    Type_Info::Type_Info(__return_storage_ptr__);
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>
             ::operator->(&local_40);
    __return_storage_ptr__->m_type_info = (ppVar3->second).m_type_info;
    __return_storage_ptr__->m_bare_type_info = (ppVar3->second).m_bare_type_info;
    uVar1 = *(undefined4 *)&(ppVar3->second).field_0x14;
    __return_storage_ptr__->m_flags = (ppVar3->second).m_flags;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar1;
  }
  local_5c = 1;
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)&itr);
  return __return_storage_ptr__;
}

Assistant:

Type_Info get_type(std::string_view name, bool t_throw = true) const {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        const auto itr = m_state.m_types.find(name);

        if (itr != m_state.m_types.end()) {
          return itr->second;
        }

        if (t_throw) {
          throw std::range_error("Type Not Known: " + std::string(name));
        } else {
          return Type_Info();
        }
      }